

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O1

void cmCacheManager::OutputKey(ostream *fout,string *key)

{
  int iVar1;
  long lVar2;
  size_t sVar3;
  ostream *poVar4;
  char *__s;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  lVar2 = std::__cxx11::string::find((char)key,0x3a);
  if (lVar2 == -1) {
    local_30._M_str = (key->_M_dataplus)._M_p;
    local_30._M_len = key->_M_string_length;
    __str._M_str = "//";
    __str._M_len = 2;
    iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_30,0,2,__str);
    __s = "";
    if (iVar1 == 0) {
      __s = "\"";
    }
  }
  else {
    __s = "\"";
  }
  sVar3 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(fout,__s,sVar3);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (fout,(key->_M_dataplus)._M_p,key->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,__s,sVar3);
  return;
}

Assistant:

void cmCacheManager::OutputKey(std::ostream& fout, std::string const& key)
{
  // support : in key name by double quoting
  const char* q =
    (key.find(':') != std::string::npos || cmHasLiteralPrefix(key, "//"))
    ? "\""
    : "";
  fout << q << key << q;
}